

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::testProgram
          (FunctionalTest20_21 *this,program **programs,bool is_separable,GLuint (*test_cases) [5],
          GLuint n_test_cases)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  uint local_44;
  GLuint i_2;
  bool result;
  GLuint i_1;
  Functions *gl;
  GLuint i;
  GLuint n_test_cases_local;
  GLuint (*test_cases_local) [5];
  bool is_separable_local;
  program **programs_local;
  FunctionalTest20_21 *this_local;
  long lVar5;
  
  if (is_separable) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar5 + 0x1680))(0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2913);
    prepareProgramPipeline(this,this->m_program_pipelines + 4,programs);
    for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
      (*this->m_shared_contexts[i_2]->_vptr_RenderContext[8])();
      (**(code **)(lVar5 + 0x1680))(0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x291d);
      prepareProgramPipeline(this,this->m_program_pipelines + i_2,programs);
    }
  }
  else {
    Utils::program::use(*programs);
    for (gl._0_4_ = 0; (uint)gl < 4; gl._0_4_ = (uint)gl + 1) {
      (*this->m_shared_contexts[(uint)gl]->_vptr_RenderContext[8])();
      Utils::program::use(*programs);
    }
  }
  local_44 = 0;
  while( true ) {
    if (n_test_cases <= local_44) {
      return true;
    }
    bVar1 = testCase(this,test_cases[local_44]);
    if (!bVar1) break;
    local_44 = local_44 + 1;
  }
  return false;
}

Assistant:

bool FunctionalTest20_21::testProgram(Utils::program** programs, bool is_separable, const glw::GLuint test_cases[][5],
									  glw::GLuint n_test_cases)
{
	/* Set program/pipeline as current for all contexts */
	if (false == is_separable)
	{
		programs[0]->use();

		for (GLuint i = 0; i < m_n_shared_contexts; ++i)
		{
			m_shared_contexts[i]->makeCurrent();
			programs[0]->use();
		}
	}
	else
	{
		/* GL entry points */
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		/* Make sure that program pipeline will be used */
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		prepareProgramPipeline(m_program_pipelines[m_n_shared_contexts], programs);

		for (GLuint i = 0; i < m_n_shared_contexts; ++i)
		{
			m_shared_contexts[i]->makeCurrent();

			/* Make sure that program pipeline will be used */
			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

			prepareProgramPipeline(m_program_pipelines[i], programs);
		}
	}

	/* Execute test */
	bool result = true;
	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		if (false == testCase(test_cases[i]))
		{
			result = false;
			break;
		}
	}

	return result;
}